

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

int64_t util::parse_bounded(char *s,int64_t min,int64_t max)

{
  invalid_argument *this;
  __cxx11 local_f8 [48];
  __cxx11 local_c8 [32];
  char local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  int64_t local_28;
  int64_t value;
  int64_t max_local;
  int64_t min_local;
  char *s_local;
  
  value = max;
  max_local = min;
  min_local = (int64_t)s;
  local_28 = parse(s);
  if ((max_local <= local_28) && (local_28 <= value)) {
    return local_28;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(local_c8,max_local);
  std::operator+(local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "parsed value outside given range [");
  std::operator+(local_88,local_a8);
  std::__cxx11::to_string(local_f8,value);
  std::operator+(local_68,local_88);
  std::operator+(local_48,(char *)local_68);
  std::invalid_argument::invalid_argument(this,(string *)local_48);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::int64_t parse_bounded(const char* s,
		std::int64_t min = std::numeric_limits<std::int64_t>::min(),
		std::int64_t max = std::numeric_limits<std::int64_t>::max())
{
	std::int64_t value = parse(s);
	if (value < min || value > max)
	{
		throw std::invalid_argument(std::string("parsed value outside given "
			"range [" + std::to_string(min) + "; " + std::to_string(max) + "]"));
	}

	return value;
}